

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::MatrixMultiply::dim_forward
          (Dim *__return_storage_ptr__,MatrixMultiply *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  ostream *os;
  invalid_argument *this_00;
  uint uVar2;
  initializer_list<unsigned_int> x;
  size_type sStack_1c0;
  string local_1b0 [32];
  ostringstream s;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes-common.cc"
                  ,0x2db,"virtual Dim cnn::MatrixMultiply::dim_forward(const vector<Dim> &) const");
  }
  if (pDVar1->nd < 2) {
    uVar2 = 1;
  }
  else {
    uVar2 = pDVar1->d[1];
  }
  if (uVar2 == pDVar1[1].d[0]) {
    if (pDVar1[1].nd == 1) {
      _s = pDVar1->d[0];
      uVar2 = pDVar1[1].bd;
      if (pDVar1[1].bd < pDVar1->bd) {
        uVar2 = pDVar1->bd;
      }
      sStack_1c0 = 1;
    }
    else {
      _s = pDVar1->d[0];
      uVar2 = pDVar1[1].bd;
      if (pDVar1[1].bd < pDVar1->bd) {
        uVar2 = pDVar1->bd;
      }
      sStack_1c0 = 2;
    }
    x._M_array = &s;
    x._M_len = sStack_1c0;
    Dim::Dim(__return_storage_ptr__,x,uVar2);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  os = std::operator<<((ostream *)&s,"Mismatched input dimensions in MatrixMultiply: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string BinaryLogLoss::as_string(const vector<string>& arg_names) const {
  ostringstream os;
  os << "binary_log_loss(" << arg_names[0] << ", " << arg_names[1] << ')';
  return os.str();
}